

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

void __thiscall CRegexParser::add_range_class(CRegexParser *this,re_recog_type cl)

{
  long lVar1;
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  ensure_range_buf_space((CRegexParser *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  lVar1 = *(long *)(in_RDI + 0x20);
  *(long *)(in_RDI + 0x20) = lVar1 + 1;
  *(undefined4 *)(*(long *)(in_RDI + 0x18) + lVar1 * 4) = 0;
  lVar1 = *(long *)(in_RDI + 0x20);
  *(long *)(in_RDI + 0x20) = lVar1 + 1;
  *(undefined4 *)(*(long *)(in_RDI + 0x18) + lVar1 * 4) = in_ESI;
  return;
}

Assistant:

void CRegexParser::add_range_class(re_recog_type cl)
{
    /* make sure we have space in the range buffer */
    ensure_range_buf_space();

    /* 
     *   add the new entry - the first character of the pair is a null
     *   character to indicate that the entry represents a class, and the
     *   second of the pair is the type code 
     */
    range_buf_[range_buf_cnt_++] = 0;
    range_buf_[range_buf_cnt_++] = (wchar_t)cl;
}